

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O1

void __thiscall
Assimp::Discreet3DSExporter::Discreet3DSExporter
          (Discreet3DSExporter *this,shared_ptr<Assimp::IOStream> *outfile,aiScene *scene)

{
  StreamWriterLE *this_00;
  _Rb_tree_header *p_Var1;
  ChunkWriter chunk_1;
  ChunkWriter chunk_2;
  ChunkWriter chunk;
  ChunkWriter local_70;
  shared_ptr<Assimp::IOStream> local_60;
  ChunkWriter local_50;
  ChunkWriter local_40;
  
  this->scene = scene;
  this_00 = &this->writer;
  local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (outfile->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (outfile->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  StreamWriter<false,_false>::StreamWriter(this_00,&local_60,false);
  if (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  p_Var1 = &(this->trafos)._M_t._M_impl.super__Rb_tree_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->meshes)._M_t._M_impl.super__Rb_tree_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  anon_unknown_0::CollectTrafos(scene->mRootNode,&this->trafos);
  anon_unknown_0::CollectMeshes(scene->mRootNode,&this->meshes);
  local_40.chunk_start_pos = (this->writer).cursor;
  local_40.writer = this_00;
  StreamWriter<false,_false>::Put<unsigned_short>(this_00,0x4d4d);
  StreamWriter<false,_false>::Put<unsigned_int>(this_00,0xdeadbeef);
  local_70.chunk_start_pos = (this->writer).cursor;
  local_70.writer = this_00;
  StreamWriter<false,_false>::Put<unsigned_short>(this_00,0x3d3d);
  StreamWriter<false,_false>::Put<unsigned_int>(this_00,0xdeadbeef);
  WriteMaterials(this);
  WriteMeshes(this);
  local_50.chunk_start_pos = (this->writer).cursor;
  local_50.writer = this_00;
  StreamWriter<false,_false>::Put<unsigned_short>(this_00,0x100);
  StreamWriter<false,_false>::Put<unsigned_int>(this_00,0xdeadbeef);
  StreamWriter<false,_false>::Put<float>(this_00,1.0);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&local_50);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&local_70);
  local_70.chunk_start_pos = (this->writer).cursor;
  local_70.writer = this_00;
  StreamWriter<false,_false>::Put<unsigned_short>(this_00,0xb000);
  StreamWriter<false,_false>::Put<unsigned_int>(this_00,0xdeadbeef);
  WriteHierarchy(this,scene->mRootNode,-1,-1);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&local_70);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&local_40);
  return;
}

Assistant:

Discreet3DSExporter:: Discreet3DSExporter(std::shared_ptr<IOStream> &outfile, const aiScene* scene)
: scene(scene)
, writer(outfile)
{
    CollectTrafos(scene->mRootNode, trafos);
    CollectMeshes(scene->mRootNode, meshes);

    ChunkWriter chunk(writer, Discreet3DS::CHUNK_MAIN);

    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_OBJMESH);
        WriteMaterials();
        WriteMeshes();

        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_MASTER_SCALE);
            writer.PutF4(1.0f);
        }
    }

    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_KEYFRAMER);
        WriteHierarchy(*scene->mRootNode, -1, -1);
    }
}